

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

int4 __thiscall ActionDefaultParams::apply(ActionDefaultParams *this,Funcdata *data)

{
  bool bVar1;
  int4 iVar2;
  Architecture *pAVar3;
  FuncCallSpecs *this_00;
  Funcdata *this_01;
  FuncProto *dst;
  Datatype *vt;
  EVP_PKEY_CTX *src;
  Funcdata *otherfunc;
  ProtoModel *evalfp;
  FuncCallSpecs *fc;
  int4 size;
  int4 i;
  Funcdata *data_local;
  ActionDefaultParams *this_local;
  
  pAVar3 = Funcdata::getArch(data);
  otherfunc = (Funcdata *)pAVar3->evalfp_called;
  if (otherfunc == (Funcdata *)0x0) {
    pAVar3 = Funcdata::getArch(data);
    otherfunc = (Funcdata *)pAVar3->defaultfp;
  }
  iVar2 = Funcdata::numCalls(data);
  for (fc._4_4_ = 0; fc._4_4_ < iVar2; fc._4_4_ = fc._4_4_ + 1) {
    this_00 = Funcdata::getCallSpecs(data,fc._4_4_);
    bVar1 = FuncProto::hasModel(&this_00->super_FuncProto);
    if (!bVar1) {
      this_01 = FuncCallSpecs::getFuncdata(this_00);
      if (this_01 == (Funcdata *)0x0) {
        pAVar3 = Funcdata::getArch(data);
        vt = &TypeFactory::getTypeVoid(pAVar3->types)->super_Datatype;
        FuncProto::setInternal(&this_00->super_FuncProto,(ProtoModel *)otherfunc,vt);
      }
      else {
        dst = Funcdata::getFuncProto(this_01);
        FuncProto::copy(&this_00->super_FuncProto,(EVP_PKEY_CTX *)dst,src);
        bVar1 = FuncProto::isModelLocked(&this_00->super_FuncProto);
        if ((!bVar1) &&
           (bVar1 = FuncProto::hasMatchingModel(&this_00->super_FuncProto,(ProtoModel *)otherfunc),
           !bVar1)) {
          FuncProto::setModel(&this_00->super_FuncProto,(ProtoModel *)otherfunc);
        }
      }
    }
    FuncCallSpecs::insertPcode(this_00,data);
    Funcdata::updateOpFromSpec(data,this_00);
  }
  return 0;
}

Assistant:

int4 ActionDefaultParams::apply(Funcdata &data)

{
  int4 i,size;
  FuncCallSpecs *fc;
  ProtoModel *evalfp = data.getArch()->evalfp_called; // Special model used when evaluating called funcs
  if (evalfp == (ProtoModel *)0) // If no special evaluation
    evalfp = data.getArch()->defaultfp;	// Use the default model

  size = data.numCalls();
  for(i=0;i<size;++i) {
    fc = data.getCallSpecs(i);
    if (!fc->hasModel()) {
      Funcdata *otherfunc = fc->getFuncdata();
      
      if (otherfunc != (Funcdata *)0) {
	fc->copy(otherfunc->getFuncProto());
	if ((!fc->isModelLocked())&&(!fc->hasMatchingModel(evalfp)))
	  fc->setModel(evalfp);
      }
      else
	fc->setInternal(evalfp,data.getArch()->types->getTypeVoid());
    }
    fc->insertPcode(data);	// Insert any necessary pcode
    data.updateOpFromSpec(fc);
  }
  return 0;			// Indicate success
}